

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Glucose::Solver::rebuildOrderHeap(Solver *this)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long in_RDI;
  Var v;
  vec<int> vs;
  Solver *in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  lbool in_stack_ffffffffffffffb6;
  bool bVar4;
  lbool local_2e;
  lbool local_2d [17];
  int local_1c;
  vec<int> *in_stack_ffffffffffffffe8;
  Heap<Glucose::Solver::VarOrderLt> *in_stack_fffffffffffffff0;
  
  vec<int>::vec((vec<int> *)&stack0xffffffffffffffe8);
  for (local_1c = 0; iVar1 = local_1c, iVar2 = nVars((Solver *)0x11d667), iVar1 < iVar2;
      local_1c = local_1c + 1) {
    pcVar3 = vec<char>::operator[]((vec<char> *)(in_RDI + 0x278),local_1c);
    bVar4 = false;
    if (*pcVar3 != '\0') {
      in_stack_ffffffffffffffb6 = value(in_stack_ffffffffffffffa8,0);
      local_2d[0] = in_stack_ffffffffffffffb6;
      lbool::lbool(&local_2e,'\x02');
      in_stack_ffffffffffffffb5 = lbool::operator==(local_2d,local_2e);
      bVar4 = (bool)in_stack_ffffffffffffffb5;
    }
    if (bVar4 != false) {
      vec<int>::push((vec<int> *)
                     CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffb6.value,
                                             CONCAT15(in_stack_ffffffffffffffb5,
                                                      in_stack_ffffffffffffffb0))),
                     (int *)in_stack_ffffffffffffffa8);
    }
  }
  Heap<Glucose::Solver::VarOrderLt>::build(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  vec<int>::~vec((vec<int> *)0x11d760);
  return;
}

Assistant:

void Solver::rebuildOrderHeap() {
    vec <Var> vs;
    for(Var v = 0; v < nVars(); v++)
        if(decision[v] && value(v) == l_Undef)
            vs.push(v);
    order_heap.build(vs);

}